

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O1

void opj_tgt_setvalue(opj_tgt_tree_t *tree,OPJ_UINT32 leafno,OPJ_INT32 value)

{
  opj_tgt_node_t *poVar1;
  
  if (tree->nodes != (opj_tgt_node_t *)0x0) {
    poVar1 = tree->nodes + leafno;
    do {
      if (poVar1->value <= value) {
        return;
      }
      poVar1->value = value;
      poVar1 = poVar1->parent;
    } while (poVar1 != (opj_tgt_node *)0x0);
  }
  return;
}

Assistant:

void opj_tgt_setvalue(opj_tgt_tree_t *tree, OPJ_UINT32 leafno, OPJ_INT32 value)
{
    opj_tgt_node_t *node;
    node = &tree->nodes[leafno];
    while (node && node->value > value) {
        node->value = value;
        node = node->parent;
    }
}